

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int resolveOrderGroupBy(NameContext *pNC,Select *pSelect,ExprList *pOrderBy,char *zType)

{
  Expr *pExpr;
  int iVar1;
  Expr *p;
  Expr *pE;
  long lVar2;
  int iVar3;
  long lVar4;
  ExprList_item *pEVar5;
  int iCol;
  char *local_90;
  int local_84;
  Parse *local_80;
  ExprList *local_78;
  NameContext *local_70;
  Walker local_68;
  
  local_84 = pSelect->pEList->nExpr;
  local_80 = pNC->pParse;
  pEVar5 = pOrderBy->a;
  iVar3 = 0;
  local_90 = zType;
  local_78 = pOrderBy;
  local_70 = pNC;
  do {
    if (local_78->nExpr <= iVar3) {
      iVar3 = sqlite3ResolveOrderGroupBy(local_80,pSelect,local_78,local_90);
      return iVar3;
    }
    pExpr = pEVar5->pExpr;
    p = sqlite3ExprSkipCollateAndLikely(pExpr);
    if (p != (Expr *)0x0) {
      if ((*local_90 == 'G') ||
         (iCol = resolveAsName((Parse *)pSelect->pEList,(ExprList *)p,pE), iCol < 1)) {
        iVar1 = sqlite3ExprIsInteger(p,&iCol);
        if (iVar1 == 0) {
          (pEVar5->u).x.iOrderByCol = 0;
          iVar1 = sqlite3ResolveExprNames(local_70,pExpr);
          if (iVar1 != 0) {
            return 1;
          }
          lVar4 = 8;
          for (lVar2 = 0; lVar2 < pSelect->pEList->nExpr; lVar2 = lVar2 + 1) {
            iVar1 = sqlite3ExprCompare((Parse *)0x0,pExpr,
                                       *(Expr **)((long)pSelect->pEList->a + lVar4 + -8),-1);
            if (iVar1 == 0) {
              if (pSelect->pWin != (Window *)0x0) {
                local_68.walkerDepth = 0;
                local_68.eCode = 0;
                local_68._38_2_ = 0;
                local_68.pParse = (Parse *)0x0;
                local_68.xSelectCallback = (_func_int_Walker_ptr_Select_ptr *)0x0;
                local_68.xSelectCallback2 = (_func_void_Walker_ptr_Select_ptr *)0x0;
                local_68.xExprCallback = resolveRemoveWindowsCb;
                local_68.u.pSelect = pSelect;
                sqlite3WalkExpr(&local_68,pExpr);
              }
              (pEVar5->u).x.iOrderByCol = (short)lVar2 + 1;
            }
            lVar4 = lVar4 + 0x18;
          }
          goto LAB_0019d2e6;
        }
        if (iCol - 0x10000U < 0xffff0001) {
          resolveOutOfRangeError(local_80,local_90,iVar3 + 1,local_84,p);
          return 1;
        }
      }
      (pEVar5->u).x.iOrderByCol = (u16)iCol;
    }
LAB_0019d2e6:
    iVar3 = iVar3 + 1;
    pEVar5 = pEVar5 + 1;
  } while( true );
}

Assistant:

static int resolveOrderGroupBy(
  NameContext *pNC,     /* The name context of the SELECT statement */
  Select *pSelect,      /* The SELECT statement holding pOrderBy */
  ExprList *pOrderBy,   /* An ORDER BY or GROUP BY clause to resolve */
  const char *zType     /* Either "ORDER" or "GROUP", as appropriate */
){
  int i, j;                      /* Loop counters */
  int iCol;                      /* Column number */
  struct ExprList_item *pItem;   /* A term of the ORDER BY clause */
  Parse *pParse;                 /* Parsing context */
  int nResult;                   /* Number of terms in the result set */

  assert( pOrderBy!=0 );
  nResult = pSelect->pEList->nExpr;
  pParse = pNC->pParse;
  for(i=0, pItem=pOrderBy->a; i<pOrderBy->nExpr; i++, pItem++){
    Expr *pE = pItem->pExpr;
    Expr *pE2 = sqlite3ExprSkipCollateAndLikely(pE);
    if( NEVER(pE2==0) ) continue;
    if( zType[0]!='G' ){
      iCol = resolveAsName(pParse, pSelect->pEList, pE2);
      if( iCol>0 ){
        /* If an AS-name match is found, mark this ORDER BY column as being
        ** a copy of the iCol-th result-set column.  The subsequent call to
        ** sqlite3ResolveOrderGroupBy() will convert the expression to a
        ** copy of the iCol-th result-set expression. */
        pItem->u.x.iOrderByCol = (u16)iCol;
        continue;
      }
    }
    if( sqlite3ExprIsInteger(pE2, &iCol) ){
      /* The ORDER BY term is an integer constant.  Again, set the column
      ** number so that sqlite3ResolveOrderGroupBy() will convert the
      ** order-by term to a copy of the result-set expression */
      if( iCol<1 || iCol>0xffff ){
        resolveOutOfRangeError(pParse, zType, i+1, nResult, pE2);
        return 1;
      }
      pItem->u.x.iOrderByCol = (u16)iCol;
      continue;
    }

    /* Otherwise, treat the ORDER BY term as an ordinary expression */
    pItem->u.x.iOrderByCol = 0;
    if( sqlite3ResolveExprNames(pNC, pE) ){
      return 1;
    }
    for(j=0; j<pSelect->pEList->nExpr; j++){
      if( sqlite3ExprCompare(0, pE, pSelect->pEList->a[j].pExpr, -1)==0 ){
        /* Since this expresion is being changed into a reference
        ** to an identical expression in the result set, remove all Window
        ** objects belonging to the expression from the Select.pWin list. */
        windowRemoveExprFromSelect(pSelect, pE);
        pItem->u.x.iOrderByCol = j+1;
      }
    }
  }
  return sqlite3ResolveOrderGroupBy(pParse, pSelect, pOrderBy, zType);
}